

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageSizeBase::ValidateReadBuffer
          (ShaderImageSizeBase *this,int x,int y,int w,int h,vec4 *expected)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  PixelFormat *pPVar4;
  reference pvVar5;
  undefined8 uVar6;
  Vector<float,_4> local_c0;
  string local_b0;
  int local_90;
  int local_8c;
  int idx;
  int xx;
  int yy;
  allocator<tcu::Vector<float,_4>_> local_71;
  undefined1 local_70 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> fb;
  vec4 g_color_eps;
  PixelFormat *pixelFormat;
  RenderTarget *renderTarget;
  bool status;
  vec4 *expected_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  ShaderImageSizeBase *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_SubcaseBase).super_GLWrapper.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[4])();
  pPVar4 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var,iVar2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)
             &fb.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             1.0 / (float)(1 << ((byte)pPVar4->redBits & 0x1f)),
             1.0 / (float)(1 << ((byte)pPVar4->greenBits & 0x1f)),
             1.0 / (float)(1 << ((byte)pPVar4->blueBits & 0x1f)),
             1.0 / (float)(1 << ((byte)pPVar4->alphaBits & 0x1f)));
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_71);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_70,
             (long)(w * h),&local_71);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_71);
  pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_70,0);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,x,y,w,h,0x1908,0x1406,
             pvVar5);
  idx = 0;
  do {
    if (h <= idx) {
      this_local._7_1_ = true;
LAB_01112802:
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_70)
      ;
      return this_local._7_1_;
    }
    for (local_8c = 0; local_8c < w; local_8c = local_8c + 1) {
      local_90 = idx * w + local_8c;
      pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_70,(long)local_90);
      bVar1 = ColorEqual(this,pvVar5,expected,
                         (vec4 *)&fb.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) {
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_70,(long)local_90);
        tcu::Vector<float,_4>::Vector(&local_c0,pvVar5);
        gl4cts::(anonymous_namespace)::ShaderImageSizeBase::ToString<tcu::Vector<float,4>>
                  (&local_b0,this,&local_c0);
        uVar6 = std::__cxx11::string::c_str();
        anon_unknown_0::Output("First bad color: %s.\n",uVar6);
        std::__cxx11::string::~string((string *)&local_b0);
        this_local._7_1_ = false;
        goto LAB_01112802;
      }
    }
    idx = idx + 1;
  } while( true );
}

Assistant:

bool ValidateReadBuffer(int x, int y, int w, int h, const vec4& expected)
	{
		bool					 status		  = true;
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		vec4					 g_color_eps  = vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		std::vector<vec4> fb(w * h);
		glReadPixels(x, y, w, h, GL_RGBA, GL_FLOAT, &fb[0]);

		for (int yy = 0; yy < h; ++yy)
		{
			for (int xx = 0; xx < w; ++xx)
			{
				const int idx = yy * w + xx;
				if (!ColorEqual(fb[idx], expected, g_color_eps))
				{
					Output("First bad color: %s.\n", ToString(fb[idx]).c_str());
					status = false;
					return status;
				}
			}
		}
		return status;
	}